

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::BeginIfExceptExpr(Validator *this,IfExceptExpr *expr)

{
  bool bVar1;
  Result result;
  undefined1 local_48 [8];
  TypeVector except_sig;
  Exception *except;
  IfExceptExpr *local_20;
  IfExceptExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc;
  local_20 = expr;
  expr_local = (IfExceptExpr *)this;
  Opcode::Opcode((Opcode *)((long)&except + 4),IfExcept);
  CheckBlockDeclaration
            (this,&(expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.loc,except._4_4_,
             &(local_20->true_).decl);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48);
  result = CheckExceptVar(this,&local_20->except_var,
                          (Exception **)
                          &except_sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = Succeeded(result);
  if (bVar1) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
               (except_sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8));
  }
  TypeChecker::OnIfExcept
            (&this->typechecker_,&(local_20->true_).decl.sig.param_types,
             &(local_20->true_).decl.sig.result_types,(TypeVector *)local_48);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::BeginIfExceptExpr(IfExceptExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::IfExcept, &expr->true_.decl);
  const Exception* except;
  TypeVector except_sig;
  if (Succeeded(CheckExceptVar(&expr->except_var, &except))) {
    except_sig = except->sig;
  }
  typechecker_.OnIfExcept(expr->true_.decl.sig.param_types,
                          expr->true_.decl.sig.result_types, except_sig);
  return Result::Ok;
}